

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleSlice.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  char *pcVar2;
  Value *sub;
  string_view attrName;
  string_view attrName_00;
  string_view attrName_01;
  string_view attrName_02;
  string_view attribute;
  string_view attribute_00;
  Slice s;
  Slice ss;
  uint8_t local_138 [16];
  ValueLength len;
  Slice sss;
  Builder b;
  Value local_50;
  Value local_40;
  Value local_30;
  Value local_20;
  int __fd;
  
  arangodb::velocypack::Builder::Builder(&b);
  arangodb::velocypack::Value::Value((Value *)&ss,Object,false);
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,(Value *)&ss);
  s._start._0_1_ = 0xb;
  s._start._4_4_ = 3;
  attrName._M_str = "b";
  attrName._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,attrName,(Value *)&s);
  sss._start._0_1_ = 3;
  sss._start._4_4_ = 1;
  attrName_00._M_str = "a";
  attrName_00._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_00,(Value *)&sss);
  arangodb::velocypack::Value::Value((Value *)&len,Array,false);
  attrName_01._M_str = "l";
  attrName_01._M_len = 1;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>
            (&b,attrName_01,(Value *)&len);
  local_20._valueType = Int;
  local_20._cType = Int64;
  local_20._value.d = 4.94065645841247e-324;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,&local_20);
  local_30._valueType = Int;
  local_30._cType = Int64;
  local_30._value.d = 9.88131291682493e-324;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,&local_30);
  sub = &local_40;
  local_40._valueType = Int;
  local_40._cType = Int64;
  local_40._value.d = 1.48219693752374e-323;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,sub);
  arangodb::velocypack::Builder::close(&b,(int)sub);
  local_50._valueType = String;
  local_50._cType = CharPtr;
  local_50._value.d = 5.50477073152108e-318;
  __fd = 4;
  attrName_02._M_str = "name";
  attrName_02._M_len = 4;
  arangodb::velocypack::Builder::addInternal<arangodb::velocypack::Value>(&b,attrName_02,&local_50);
  arangodb::velocypack::Builder::close(&b,__fd);
  s._start = arangodb::velocypack::Builder::start(&b);
  poVar1 = std::operator<<((ostream *)&std::cout,"Slice: ");
  poVar1 = arangodb::velocypack::operator<<(poVar1,&s);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Type: ");
  poVar1 = operator<<(poVar1,arangodb::velocypack::SliceStaticData::TypeMap[*s._start]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Bytesize: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
  byteSize((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Members: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  if (arangodb::velocypack::SliceStaticData::TypeMap[*s._start] == Object) {
    attribute._M_str = "l";
    attribute._M_len = 1;
    ss = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
         get((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s,attribute);
    poVar1 = std::operator<<((ostream *)&std::cout,"Length of .l: ");
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    length((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&ss);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
    poVar1 = std::operator<<((ostream *)&std::cout,"Second entry of .l:");
    sss = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
          ::at((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&ss,1);
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
    getInt((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&sss);
    poVar1 = std::ostream::_M_insert<long>((long)poVar1);
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  attribute_00._M_str = "name";
  attribute_00._M_len = 4;
  sss = arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
        get((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s,attribute_00);
  if ((ulong)*sss._start - 0x40 < 0x80) {
    pcVar2 = arangodb::velocypack::
             SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::getString
                       ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&sss,
                        &len);
    poVar1 = std::operator<<((ostream *)&std::cout,"Name in .name: ");
    ss._start = local_138;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ss,pcVar2,pcVar2 + len);
    poVar1 = std::operator<<(poVar1,(string *)&ss);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&ss);
  }
  arangodb::velocypack::Builder::~Builder(&b);
  return 0;
}

Assistant:

int main(int, char*[]) {
  VELOCYPACK_GLOBAL_EXCEPTION_TRY

  // create an object with attributes "b", "a", "l" and "name"
  // note that the attribute names will be sorted in the target VPack object!
  Builder b;

  b(Value(ValueType::Object))("b", Value(12))("a", Value(true))(
      "l", Value(ValueType::Array))(Value(1))(Value(2))(Value(3))()(
      "name", Value("Gustav"))();

  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // inspect the outermost value (should be an Object...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  if (s.isObject()) {
    Slice ss = s.get("l");  // Now ss points to the subvalue under "l"
    std::cout << "Length of .l: " << ss.length() << std::endl;
    std::cout << "Second entry of .l:" << ss.at(1).getInt() << std::endl;
  }

  Slice sss = s.get("name");
  if (sss.isString()) {
    ValueLength len;
    char const* st = sss.getString(len);
    std::cout << "Name in .name: " << std::string(st, checkOverflow(len))
              << std::endl;
  }

  VELOCYPACK_GLOBAL_EXCEPTION_CATCH
}